

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib543.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib543.c"
                  ,0x29,iVar2,uVar3);
  }
  if (iVar2 == 0) {
    lVar4 = curl_easy_init();
    if (lVar4 == 0) {
      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
      iVar2 = 0x7e;
    }
    else {
      lVar5 = curl_easy_escape(lVar4,test::a,0x14);
      if (lVar5 != 0) {
        curl_mprintf("%s\n",lVar5);
        curl_free(lVar5);
      }
      curl_easy_cleanup(lVar4);
      curl_global_cleanup();
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int test(char *URL)
{
  static const unsigned char a[] = {
      0x9c, 0x26, 0x4b, 0x3d, 0x49, 0x4, 0xa1, 0x1,
      0xe0, 0xd8, 0x7c,  0x20, 0xb7, 0xef, 0x53, 0x29, 0xfa,
      0x1d, 0x57, 0xe1};

  CURL *easy;
  int asize;
  char *s;
  CURLcode res = CURLE_OK;
  (void)URL;

  global_init(CURL_GLOBAL_ALL);
  easy = curl_easy_init();
  if(!easy) {
    fprintf(stderr, "curl_easy_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  asize = (int)sizeof(a);

  s = curl_easy_escape(easy, (const char *)a, asize);

  if(s)
    printf("%s\n", s);

  if(s)
    curl_free(s);

  curl_easy_cleanup(easy);
  curl_global_cleanup();

  return 0;
}